

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprCodeSubselect(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  uint uVar2;
  Vdbe *p;
  Select *p_00;
  Expr *pEVar3;
  VdbeOp *pVVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  SelectDest SStack_50;
  
  if (pExpr->op != 0x83) {
    return 0;
  }
  p = pParse->pVdbe;
  p_00 = (pExpr->x).pSelect;
  uVar2 = pExpr->flags;
  iVar5 = 0;
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 >> 0x19 & 1) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",(ulong)p_00->selId);
      sqlite3VdbeAddOp2(p,0xc,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      return pExpr->iTable;
    }
    pExpr->flags = uVar2 | 0x2000000;
    iVar5 = pParse->nMem + 1;
    pParse->nMem = iVar5;
    (pExpr->y).sub.regReturn = iVar5;
    iVar5 = sqlite3VdbeAddOp2(p,0x46,0,iVar5);
    (pExpr->y).sub.iAddr = iVar5 + 1;
    iVar5 = sqlite3VdbeAddOp0(p,0x11);
  }
  pcVar6 = "";
  if (iVar5 == 0) {
    pcVar6 = "CORRELATED ";
  }
  iVar8 = 1;
  sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar6,(ulong)p_00->selId);
  uVar1 = pExpr->op;
  if (uVar1 == 0x83) {
    iVar8 = p_00->pEList->nExpr;
  }
  SStack_50.iSDParm = pParse->nMem + 1;
  iVar7 = pParse->nMem + iVar8;
  SStack_50.iSdst = 0;
  SStack_50.nSdst = 0;
  SStack_50.zAffSdst = (char *)0x0;
  pParse->nMem = iVar7;
  if (uVar1 == 0x83) {
    SStack_50.nSdst = iVar8;
    SStack_50.iSdst = SStack_50.iSDParm;
    sqlite3VdbeAddOp3(p,0x49,0,SStack_50.iSDParm,iVar7);
    SStack_50.eDest = '\n';
  }
  else {
    sqlite3VdbeAddOp2(p,0x46,0,SStack_50.iSDParm);
    SStack_50.eDest = '\x03';
  }
  pEVar3 = sqlite3ExprAlloc(pParse->db,0x93,sqlite3IntTokens + 1,0);
  if (p_00->pLimit == (Expr *)0x0) {
    pEVar3 = sqlite3PExpr(pParse,0x8d,pEVar3,(Expr *)0x0);
    p_00->pLimit = pEVar3;
  }
  else {
    sqlite3ExprDelete(pParse->db,p_00->pLimit->pLeft);
    p_00->pLimit->pLeft = pEVar3;
  }
  p_00->iLimit = 0;
  iVar7 = sqlite3Select(pParse,p_00,&SStack_50);
  iVar8 = 0;
  if ((iVar7 == 0) && (pExpr->iTable = SStack_50.iSDParm, iVar8 = SStack_50.iSDParm, iVar5 != 0)) {
    sqlite3VdbeJumpHere(p,iVar5);
    sqlite3VdbeAddOp1(p,0x42,(pExpr->y).sub.regReturn);
    iVar5 = p->nOp;
    pVVar4 = sqlite3VdbeGetOp(p,(pExpr->y).sub.iAddr + -1);
    pVVar4->p1 = iVar5 + -1;
  }
  return iVar8;
}

Assistant:

static int exprCodeSubselect(Parse *pParse, Expr *pExpr){
  int reg = 0;
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->op==TK_SELECT ){
    reg = sqlite3CodeSubselect(pParse, pExpr);
  }
#endif
  return reg;
}